

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaTargetGenerator::WriteTargetDependInfo
          (cmNinjaTargetGenerator *this,string *lang,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  cmMakefile *pcVar3;
  cmTarget *this_00;
  pointer pcVar4;
  cmGeneratorTarget *pcVar5;
  cmSourceFile *pcVar6;
  pointer puVar7;
  cmInstallGenerator *pcVar8;
  _Base_ptr p_Var9;
  cmInstallExportGenerator *this_01;
  pointer puVar10;
  cmExportBuildFileGenerator *pcVar11;
  String *pSVar12;
  _func_int **__s2;
  pointer pbVar13;
  pointer puVar14;
  int iVar15;
  uint uVar16;
  Value *pVVar17;
  string *psVar18;
  cmGlobalNinjaGenerator *pcVar19;
  cmFileSet *this_02;
  string *psVar20;
  mapped_type *ppcVar21;
  cmInstallFileSetGenerator *this_03;
  iterator iVar22;
  Value *pVVar23;
  Value *pVVar24;
  undefined8 uVar25;
  cmInstallCxxModuleBmiGenerator *pcVar26;
  _Rb_tree_header *p_Var27;
  _Base_ptr p_Var28;
  vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  *pvVar29;
  _Base_ptr p_Var30;
  _Base_ptr p_Var31;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  pointer cge;
  pointer puVar32;
  cmInstallCxxModuleBmiGenerator *this_04;
  pointer ppcVar33;
  pointer puVar34;
  pointer ppcVar35;
  char *value;
  _Alloc_hider _Var36;
  long lVar37;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *ig_1;
  pointer ppcVar38;
  pointer ppcVar39;
  pointer ppcVar40;
  string *i;
  pointer path;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  static_string_view sVar41;
  string tdin;
  Value fs_dest;
  string export_name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
  sf_map;
  string fs_type;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  Value tdi;
  string mod_dir;
  long *local_348;
  long local_340;
  long local_338 [2];
  string *local_328;
  string *local_320;
  string *local_318;
  cmGeneratedFileStream tdif;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_file_sets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  
  Json::Value::Value(&tdi,objectValue);
  Json::Value::Value((Value *)&tdif,lang);
  pVVar17 = Json::Value::operator[](&tdi,"language");
  Json::Value::operator=(pVVar17,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
       (lang->_M_dataplus)._M_p;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
       lang->_M_string_length;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0x6;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (long)"The CMAKE_" + 4;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ = 0xc;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ =
       (long)"CMAKE_CUDA_COMPILER_ID" + 10;
  views._M_len = 3;
  views._M_array = (iterator)&tdif;
  cmCatViews_abi_cxx11_((string *)&sf_map,views);
  psVar18 = cmMakefile::GetSafeDefinition(pcVar3,(string *)&sf_map);
  Json::Value::Value((Value *)&tdin,psVar18);
  pVVar17 = Json::Value::operator[](&tdi,"compiler-id");
  Json::Value::operator=(pVVar17,(Value *)&tdin);
  Json::Value::~Value((Value *)&tdin);
  if ((_Base_ptr *)sf_map._M_t._M_impl._0_8_ !=
      &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)sf_map._M_t._M_impl._0_8_,
                    (ulong)((long)&(sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  mod_dir._M_dataplus._M_p = (pointer)&mod_dir.field_2;
  mod_dir._M_string_length = 0;
  mod_dir.field_2._M_local_buf[0] = '\0';
  iVar15 = std::__cxx11::string::compare((char *)lang);
  if (iVar15 == 0) {
    pcVar5 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    psVar18 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                        ((this->super_cmCommonTargetGenerator).Makefile);
    cmGeneratorTarget::GetFortranModuleDirectory((string *)&tdif,pcVar5,psVar18);
    std::__cxx11::string::operator=((string *)&mod_dir,(string *)&tdif);
    uVar25 = tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_;
    _Var36._M_p = (pointer)tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                           _vptr_basic_ostream;
    if (tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
        == (_func_int **)
           &tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
    goto LAB_00287ed7;
  }
  else {
    iVar15 = std::__cxx11::string::compare((char *)lang);
    if (iVar15 != 0) goto LAB_00287ed7;
    pcVar19 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmsys::SystemTools::CollapseFullPath
              (&tdin,&((this->super_cmCommonTargetGenerator).GeneratorTarget)->ObjectDirectory);
    (*(pcVar19->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x16]
    )(&tdif,pcVar19,&tdin,config);
    std::__cxx11::string::operator=((string *)&mod_dir,(string *)&tdif);
    if (tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
        != (_func_int **)
           &tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                      + 1);
    }
    uVar25 = tdin.field_2._M_allocated_capacity;
    _Var36._M_p = tdin._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tdin._M_dataplus._M_p == &tdin.field_2) goto LAB_00287ed7;
  }
  operator_delete(_Var36._M_p,uVar25 + 1);
LAB_00287ed7:
  if (mod_dir._M_string_length == 0) {
    cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile)
    ;
    std::__cxx11::string::_M_assign((string *)&mod_dir);
  }
  Json::Value::Value((Value *)&tdif,&mod_dir);
  pVVar17 = Json::Value::operator[](&tdi,"module-dir");
  Json::Value::operator=(pVVar17,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  iVar15 = std::__cxx11::string::compare((char *)lang);
  if (iVar15 == 0) {
    pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
    paVar1 = &tdin.field_2;
    tdin._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&tdin,"CMAKE_Fortran_SUBMODULE_SEP","");
    psVar18 = cmMakefile::GetSafeDefinition(pcVar3,&tdin);
    Json::Value::Value((Value *)&tdif,psVar18);
    pVVar17 = Json::Value::operator[](&tdi,"submodule-sep");
    Json::Value::operator=(pVVar17,(Value *)&tdif);
    Json::Value::~Value((Value *)&tdif);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tdin._M_dataplus._M_p != paVar1) {
      operator_delete(tdin._M_dataplus._M_p,tdin.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
    tdin._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&tdin,"CMAKE_Fortran_SUBMODULE_EXT","");
    psVar18 = cmMakefile::GetSafeDefinition(pcVar3,&tdin);
    Json::Value::Value((Value *)&tdif,psVar18);
    pVVar17 = Json::Value::operator[](&tdi,"submodule-ext");
    Json::Value::operator=(pVVar17,(Value *)&tdif);
    Json::Value::~Value((Value *)&tdif);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tdin._M_dataplus._M_p != paVar1) {
      operator_delete(tdin._M_dataplus._M_p,tdin.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::compare((char *)lang);
  }
  psVar18 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdif,psVar18);
  pVVar17 = Json::Value::operator[](&tdi,"dir-cur-bld");
  Json::Value::operator=(pVVar17,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  psVar18 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdif,psVar18);
  pVVar17 = Json::Value::operator[](&tdi,"dir-cur-src");
  Json::Value::operator=(pVVar17,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  psVar18 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdif,psVar18);
  pVVar17 = Json::Value::operator[](&tdi,"dir-top-bld");
  Json::Value::operator=(pVVar17,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  psVar18 = cmMakefile::GetHomeDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdif,psVar18);
  pVVar17 = Json::Value::operator[](&tdi,"dir-top-src");
  Json::Value::operator=(pVVar17,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  Json::Value::Value((Value *)&tdif,arrayValue);
  pVVar17 = Json::Value::operator[](&tdi,"include-dirs");
  pVVar17 = Json::Value::operator=(pVVar17,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328 = lang;
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)this->LocalGenerator,&includes,
             (this->super_cmCommonTargetGenerator).GeneratorTarget,lang,config);
  pbVar13 = includes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (includes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      includes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    path = includes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar19 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      psVar18 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar19,path);
      Json::Value::Value((Value *)&tdif,psVar18);
      Json::Value::append(pVVar17,(Value *)&tdif);
      Json::Value::~Value((Value *)&tdif);
      path = path + 1;
    } while (path != pbVar13);
  }
  Json::Value::Value((Value *)&tdif,arrayValue);
  pVVar17 = Json::Value::operator[](&tdi,"linked-target-dirs");
  pVVar17 = Json::Value::operator=(pVVar17,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  cmCommonTargetGenerator::GetLinkedTargetDirectories
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&tdin,&this->super_cmCommonTargetGenerator,config);
  pSVar12 = (String *)CONCAT44(tdin._M_string_length._4_4_,(undefined4)tdin._M_string_length);
  if ((String *)tdin._M_dataplus._M_p != pSVar12) {
    _Var36 = tdin._M_dataplus;
    do {
      Json::Value::Value((Value *)&tdif,(String *)_Var36._M_p);
      Json::Value::append(pVVar17,(Value *)&tdif);
      Json::Value::~Value((Value *)&tdif);
      _Var36._M_p = _Var36._M_p + 0x20;
    } while ((String *)_Var36._M_p != pSVar12);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tdin);
  this_00 = ((this->super_cmCommonTargetGenerator).GeneratorTarget)->Target;
  cmTarget::GetAllFileSetNames_abi_cxx11_(&all_file_sets,this_00);
  Json::Value::Value((Value *)&tdif,objectValue);
  pVVar17 = Json::Value::operator[](&tdi,"cxx-modules");
  pVVar17 = Json::Value::operator=(pVVar17,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  local_318 = all_file_sets.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (all_file_sets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      all_file_sets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar18 = all_file_sets.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_02 = cmTarget::GetFileSet(this_00,psVar18);
      if (this_02 == (cmFileSet *)0x0) {
        pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
        psVar20 = cmTarget::GetName_abi_cxx11_(this_00);
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
             (psVar20->_M_dataplus)._M_p;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
             psVar20->_M_string_length;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)0x8;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
             (long)"\nTarget \"" + 1;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ = 0x1f;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ =
             anon_var_dwarf_b2e926;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._56_8_ =
             (psVar18->_M_dataplus)._M_p;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._48_8_ =
             psVar18->_M_string_length;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._64_8_ = 0x18;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._72_8_ =
             anon_var_dwarf_b2e940;
        views_00._M_len = 5;
        views_00._M_array = (iterator)&tdif;
        cmCatViews_abi_cxx11_(&tdin,views_00);
        cmMakefile::IssueMessage(pcVar3,INTERNAL_ERROR,&tdin);
        uVar25 = tdin.field_2._M_allocated_capacity;
        _Var36 = tdin._M_dataplus;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)tdin._M_dataplus._M_p != &tdin.field_2) goto LAB_00288ca6;
      }
      else {
        fs_type._M_dataplus._M_p = (pointer)&fs_type.field_2;
        pcVar4 = (this_02->Type)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&fs_type,pcVar4,pcVar4 + (this_02->Type)._M_string_length);
        if ((fs_type._M_string_length == 0xb) &&
           (iVar15 = bcmp(fs_type._M_dataplus._M_p,"CXX_MODULES",0xb), iVar15 == 0)) {
          cmFileSet::CompileFileEntries(&fileEntries,this_02);
          cmFileSet::CompileDirectoryEntries(&directoryEntries,this_02);
          pcVar5 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
          local_320 = psVar18;
          cmFileSet::EvaluateDirectoryEntries
                    (&directories,this_02,&directoryEntries,pcVar5->LocalGenerator,config,pcVar5,
                     (cmGeneratorExpressionDAGChecker *)0x0);
          puVar14 = fileEntries.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          tdin._M_string_length._0_4_ = 0;
          tdin.field_2._M_allocated_capacity = 0;
          tdin.field_2._8_8_ = &tdin._M_string_length;
          for (cge = fileEntries.
                     super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; cge != puVar14; cge = cge + 1) {
            pcVar5 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
            cmFileSet::EvaluateFileEntry
                      (this_02,&directories,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)&tdin,cge,pcVar5->LocalGenerator,config,pcVar5,
                       (cmGeneratorExpressionDAGChecker *)0x0);
          }
          sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &sf_map._M_t._M_impl.super__Rb_tree_header._M_header;
          sf_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          objectSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          objectSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          objectSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          cmGeneratorTarget::GetObjectSources
                    ((this->super_cmCommonTargetGenerator).GeneratorTarget,&objectSources,config);
          ppcVar35 = objectSources.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          for (ppcVar38 = objectSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppcVar38 != ppcVar35;
              ppcVar38 = ppcVar38 + 1) {
            pcVar6 = *ppcVar38;
            psVar18 = cmSourceFile::GetFullPath_abi_cxx11_(pcVar6);
            fs_dest.value_.string_ = (char *)&fs_dest.comments_;
            pcVar4 = (psVar18->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&fs_dest,pcVar4,pcVar4 + psVar18->_M_string_length);
            if (fs_dest._8_8_ == 0) {
              pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
              psVar18 = cmTarget::GetName_abi_cxx11_(this_00);
              tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
                   (psVar18->_M_dataplus)._M_p;
              tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
                   psVar18->_M_string_length;
              tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream = (_func_int **)0x8;
              tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
                   (long)"\nTarget \"" + 1;
              tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ = 0x23;
              tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ =
                   anon_var_dwarf_b2f2c4;
              views_01._M_len = 3;
              views_01._M_array = (iterator)&tdif;
              cmCatViews_abi_cxx11_(&export_name,views_01);
              cmMakefile::IssueMessage(pcVar3,INTERNAL_ERROR,&export_name);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)export_name._M_dataplus._M_p != &export_name.field_2) {
                operator_delete(export_name._M_dataplus._M_p,
                                export_name.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              ppcVar21 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
                         ::operator[](&sf_map,(key_type *)&fs_dest);
              *ppcVar21 = pcVar6;
            }
            if (fs_dest.value_ != &fs_dest.comments_) {
              operator_delete(fs_dest.value_.string_,
                              (long)fs_dest.comments_.ptr_._M_t.
                                    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                    .
                                    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                    ._M_head_impl + 1);
            }
          }
          if (objectSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(objectSources.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)objectSources.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)objectSources.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          Json::Value::Value(&fs_dest,nullValue);
          pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
          puVar7 = (pcVar3->InstallGenerators).
                   super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar32 = (pcVar3->InstallGenerators).
                         super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar32 != puVar7;
              puVar32 = puVar32 + 1) {
            pcVar8 = (puVar32->_M_t).
                     super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                     .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
            if (pcVar8 == (cmInstallGenerator *)0x0) {
              this_03 = (cmInstallFileSetGenerator *)0x0;
            }
            else {
              this_03 = (cmInstallFileSetGenerator *)
                        __dynamic_cast(pcVar8,&cmInstallGenerator::typeinfo,
                                       &cmInstallFileSetGenerator::typeinfo,0);
            }
            if (((this_03 != (cmInstallFileSetGenerator *)0x0) &&
                (this_03->Target == (this->super_cmCommonTargetGenerator).GeneratorTarget)) &&
               (this_03->FileSet == this_02)) {
              cmInstallFileSetGenerator::GetDestination(&export_name,this_03,config);
              Json::Value::Value((Value *)&tdif,&export_name);
              Json::Value::operator=(&fs_dest,(Value *)&tdif);
              Json::Value::~Value((Value *)&tdif);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)export_name._M_dataplus._M_p != &export_name.field_2) {
                operator_delete(export_name._M_dataplus._M_p,
                                export_name.field_2._M_allocated_capacity + 1);
              }
            }
          }
          if ((size_type *)tdin.field_2._8_8_ != &tdin._M_string_length) {
            uVar25 = tdin.field_2._8_8_;
            do {
              p_Var28 = *(_Base_ptr *)(uVar25 + 0x40);
              p_Var31 = ((_Rb_tree_node_base *)(uVar25 + 0x40))->_M_parent;
              if (p_Var28 != p_Var31) {
                do {
                  iVar22 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
                           ::find(&sf_map._M_t,(key_type *)p_Var28);
                  if ((_Rb_tree_header *)iVar22._M_node ==
                      &sf_map._M_t._M_impl.super__Rb_tree_header) {
                    pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
                    psVar18 = cmTarget::GetName_abi_cxx11_(this_00);
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
                         (psVar18->_M_dataplus)._M_p;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
                         psVar18->_M_string_length;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream = (_func_int **)0x8;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
                         (long)"\nTarget \"" + 1;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
                         0x13;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ =
                         anon_var_dwarf_b2f2df;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._56_4_ =
                         p_Var28->_M_color;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._60_4_ =
                         *(undefined4 *)&p_Var28->field_0x4;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._48_8_ =
                         p_Var28->_M_parent;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._64_8_ =
                         0x32;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._72_8_ =
                         anon_var_dwarf_b2f2ec;
                    views_02._M_len = 5;
                    views_02._M_array = (iterator)&tdif;
                    cmCatViews_abi_cxx11_(&export_name,views_02);
                    cmMakefile::IssueMessage(pcVar3,INTERNAL_ERROR,&export_name);
                  }
                  else if (*(cmSourceFile **)(iVar22._M_node + 2) == (cmSourceFile *)0x0) {
                    pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
                    psVar18 = cmTarget::GetName_abi_cxx11_(this_00);
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
                         (psVar18->_M_dataplus)._M_p;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
                         psVar18->_M_string_length;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream = (_func_int **)0x8;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
                         (long)"\nTarget \"" + 1;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
                         0x13;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ =
                         anon_var_dwarf_b2f2df;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._56_4_ =
                         p_Var28->_M_color;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._60_4_ =
                         *(undefined4 *)&p_Var28->field_0x4;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._48_8_ =
                         p_Var28->_M_parent;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._64_8_ =
                         0x26;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._72_8_ =
                         anon_var_dwarf_b2f307;
                    views_03._M_len = 5;
                    views_03._M_array = (iterator)&tdif;
                    cmCatViews_abi_cxx11_(&export_name,views_03);
                    cmMakefile::IssueMessage(pcVar3,INTERNAL_ERROR,&export_name);
                  }
                  else {
                    GetObjectFilePath(&export_name,this,*(cmSourceFile **)(iVar22._M_node + 2),
                                      config);
                    Json::Value::Value((Value *)&tdif,objectValue);
                    pVVar23 = Json::Value::operator[](pVVar17,&export_name);
                    pVVar23 = Json::Value::operator=(pVVar23,(Value *)&tdif);
                    Json::Value::~Value((Value *)&tdif);
                    Json::Value::Value((Value *)&tdif,(String *)p_Var28);
                    pVVar24 = Json::Value::operator[](pVVar23,"source");
                    Json::Value::operator=(pVVar24,(Value *)&tdif);
                    Json::Value::~Value((Value *)&tdif);
                    Json::Value::Value((Value *)&tdif,(String *)(uVar25 + 0x20));
                    pVVar24 = Json::Value::operator[](pVVar23,"relative-directory");
                    Json::Value::operator=(pVVar24,(Value *)&tdif);
                    Json::Value::~Value((Value *)&tdif);
                    Json::Value::Value((Value *)&tdif,&this_02->Name);
                    pVVar24 = Json::Value::operator[](pVVar23,"name");
                    Json::Value::operator=(pVVar24,(Value *)&tdif);
                    Json::Value::~Value((Value *)&tdif);
                    Json::Value::Value((Value *)&tdif,&this_02->Type);
                    pVVar24 = Json::Value::operator[](pVVar23,"type");
                    Json::Value::operator=(pVVar24,(Value *)&tdif);
                    Json::Value::~Value((Value *)&tdif);
                    sVar41 = cmFileSetVisibilityToName(this_02->Visibility);
                    objectSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)&objectSources.
                                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&objectSources,sVar41.super_string_view._M_str,
                               sVar41.super_string_view._M_str + sVar41.super_string_view._M_len);
                    Json::Value::Value((Value *)&tdif,(String *)&objectSources);
                    pVVar24 = Json::Value::operator[](pVVar23,"visibility");
                    Json::Value::operator=(pVVar24,(Value *)&tdif);
                    Json::Value::~Value((Value *)&tdif);
                    if (objectSources.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start !=
                        (pointer)&objectSources.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      operator_delete(objectSources.
                                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)objectSources.
                                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
                    }
                    pVVar23 = Json::Value::operator[](pVVar23,"destination");
                    Json::Value::operator=(pVVar23,&fs_dest);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)export_name._M_dataplus._M_p != &export_name.field_2) {
                    operator_delete(export_name._M_dataplus._M_p,
                                    export_name.field_2._M_allocated_capacity + 1);
                  }
                  p_Var28 = p_Var28 + 1;
                } while (p_Var28 != p_Var31);
              }
              uVar25 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar25);
            } while ((size_type *)uVar25 != &tdin._M_string_length);
          }
          Json::Value::~Value(&fs_dest);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
          ::~_Rb_tree(&sf_map._M_t);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)&tdin);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&directories);
          std::
          vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
          ::~vector(&directoryEntries);
          std::
          vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
          ::~vector(&fileEntries);
          psVar18 = local_320;
        }
        uVar25 = fs_type.field_2._M_allocated_capacity;
        _Var36._M_p = fs_type._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fs_type._M_dataplus._M_p != &fs_type.field_2) {
LAB_00288ca6:
          operator_delete(_Var36._M_p,uVar25 + 1);
        }
      }
      psVar18 = psVar18 + 1;
    } while (psVar18 != local_318);
  }
  Json::Value::Value((Value *)&tdif,config);
  pVVar17 = Json::Value::operator[](&tdi,"config");
  Json::Value::operator=(pVVar17,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  Json::Value::Value((Value *)&tdif,arrayValue);
  pVVar17 = Json::Value::operator[](&tdi,"exports");
  pVVar17 = Json::Value::operator=(pVVar17,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  cmGeneratorTarget::GetExportName_abi_cxx11_
            (&export_name,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
  puVar32 = (pcVar3->InstallGenerators).
            super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar7 = (pcVar3->InstallGenerators).
           super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar32 == puVar7) {
    this_04 = (cmInstallCxxModuleBmiGenerator *)0x0;
  }
  else {
    pcVar5 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    this_04 = (cmInstallCxxModuleBmiGenerator *)0x0;
    do {
      pcVar8 = (puVar32->_M_t).
               super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
               .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
      if (pcVar8 == (cmInstallGenerator *)0x0) {
        pcVar26 = (cmInstallCxxModuleBmiGenerator *)0x0;
      }
      else {
        pcVar26 = (cmInstallCxxModuleBmiGenerator *)
                  __dynamic_cast(pcVar8,&cmInstallGenerator::typeinfo,
                                 &cmInstallCxxModuleBmiGenerator::typeinfo,0);
      }
      if ((pcVar26 == (cmInstallCxxModuleBmiGenerator *)0x0) || (pcVar26->Target != pcVar5)) {
        pcVar26 = this_04;
      }
      this_04 = pcVar26;
      puVar32 = puVar32 + 1;
    } while (puVar32 != puVar7);
  }
  if (this_04 == (cmInstallCxxModuleBmiGenerator *)0x0) {
    Json::Value::Value((Value *)&tdif,nullValue);
    pVVar23 = Json::Value::operator[](&tdi,"bmi-installation");
    Json::Value::operator=(pVVar23,(Value *)&tdif);
  }
  else {
    Json::Value::Value((Value *)&tdif,objectValue);
    Json::Value::Value((Value *)&tdin,&this_04->FilePermissions);
    pVVar23 = Json::Value::operator[]((Value *)&tdif,"permissions");
    Json::Value::operator=(pVVar23,(Value *)&tdin);
    Json::Value::~Value((Value *)&tdin);
    cmInstallCxxModuleBmiGenerator::GetDestination((string *)&sf_map,this_04,config);
    Json::Value::Value((Value *)&tdin,(String *)&sf_map);
    pVVar23 = Json::Value::operator[]((Value *)&tdif,"destination");
    Json::Value::operator=(pVVar23,(Value *)&tdin);
    Json::Value::~Value((Value *)&tdin);
    if ((_Base_ptr *)sf_map._M_t._M_impl._0_8_ !=
        &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)sf_map._M_t._M_impl._0_8_,
                      (ulong)((long)&(sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                     ->_M_color + 1));
    }
    uVar16 = (this_04->super_cmInstallGenerator).Message - MessageAlways;
    if (uVar16 < 3) {
      value = &DAT_006a3fdc + *(int *)(&DAT_006a3fdc + (ulong)uVar16 * 4);
    }
    else {
      value = "";
    }
    Json::Value::Value((Value *)&tdin,value);
    pVVar23 = Json::Value::operator[]((Value *)&tdif,"message-level");
    Json::Value::operator=(pVVar23,(Value *)&tdin);
    Json::Value::~Value((Value *)&tdin);
    cmInstallCxxModuleBmiGenerator::GetScriptLocation((string *)&sf_map,this_04,config);
    Json::Value::Value((Value *)&tdin,(String *)&sf_map);
    pVVar23 = Json::Value::operator[]((Value *)&tdif,"script-location");
    Json::Value::operator=(pVVar23,(Value *)&tdin);
    Json::Value::~Value((Value *)&tdin);
    if ((_Base_ptr *)sf_map._M_t._M_impl._0_8_ !=
        &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)sf_map._M_t._M_impl._0_8_,
                      (ulong)((long)&(sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                     ->_M_color + 1));
    }
    pVVar23 = Json::Value::operator[](&tdi,"bmi-installation");
    Json::Value::operator=(pVVar23,(Value *)&tdif);
  }
  Json::Value::~Value((Value *)&tdif);
  pcVar19 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  p_Var28 = (pcVar19->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.ExportSets.
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
            ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var27 = &(pcVar19->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.ExportSets.
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
             ._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var28 != p_Var27) {
    do {
      p_Var31 = *(_Base_ptr *)(p_Var28 + 2);
      p_Var9 = p_Var28[2]._M_parent;
      lVar37 = (long)p_Var9 - (long)p_Var31 >> 5;
      p_Var30 = p_Var31;
      if (0 < lVar37) {
        pcVar5 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
        p_Var30 = (_Base_ptr)
                  ((long)&p_Var31->_M_color + ((long)p_Var9 - (long)p_Var31 & 0xffffffffffffffe0U));
        lVar37 = lVar37 + 1;
        p_Var31 = (_Base_ptr)&p_Var31->_M_left;
        do {
          if (*(cmGeneratorTarget **)(p_Var31[-1]._M_left + 1) == pcVar5) {
            p_Var31 = (_Base_ptr)&p_Var31[-1]._M_left;
            goto LAB_00289101;
          }
          if (*(cmGeneratorTarget **)(p_Var31[-1]._M_right + 1) == pcVar5) {
            p_Var31 = (_Base_ptr)&p_Var31[-1]._M_right;
            goto LAB_00289101;
          }
          if (*(cmGeneratorTarget **)(*(long *)p_Var31 + 0x20) == pcVar5) goto LAB_00289101;
          if (*(cmGeneratorTarget **)(p_Var31->_M_parent + 1) == pcVar5) {
            p_Var31 = (_Base_ptr)&p_Var31->_M_parent;
            goto LAB_00289101;
          }
          lVar37 = lVar37 + -1;
          p_Var31 = p_Var31 + 1;
        } while (1 < lVar37);
      }
      lVar37 = (long)p_Var9 - (long)p_Var30 >> 3;
      if (lVar37 == 1) {
LAB_002890d9:
        p_Var31 = p_Var30;
        if (*(cmGeneratorTarget **)(*(long *)p_Var30 + 0x20) !=
            (this->super_cmCommonTargetGenerator).GeneratorTarget) {
          p_Var31 = p_Var9;
        }
      }
      else if (lVar37 == 2) {
LAB_002890c4:
        p_Var31 = p_Var30;
        if (*(cmGeneratorTarget **)(*(long *)p_Var30 + 0x20) !=
            (this->super_cmCommonTargetGenerator).GeneratorTarget) {
          p_Var30 = (_Base_ptr)&p_Var30->_M_parent;
          goto LAB_002890d9;
        }
      }
      else {
        p_Var31 = p_Var9;
        if ((lVar37 == 3) &&
           (p_Var31 = p_Var30,
           *(cmGeneratorTarget **)(*(long *)p_Var30 + 0x20) !=
           (this->super_cmCommonTargetGenerator).GeneratorTarget)) {
          p_Var30 = (_Base_ptr)&p_Var30->_M_parent;
          goto LAB_002890c4;
        }
      }
LAB_00289101:
      if (p_Var31 != p_Var9) {
        p_Var9 = *(_Base_ptr *)(p_Var28 + 4);
        for (p_Var31 = p_Var28[3]._M_right; p_Var31 != p_Var9;
            p_Var31 = (_Base_ptr)&p_Var31->_M_parent) {
          this_01 = *(cmInstallExportGenerator **)p_Var31;
          Json::Value::Value((Value *)&tdif,objectValue);
          sf_map._M_t._M_impl._0_8_ = &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
          ;
          pcVar4 = (this_01->CxxModulesDirectory)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&sf_map,pcVar4,
                     pcVar4 + (this_01->CxxModulesDirectory)._M_string_length);
          cmInstallExportGenerator::GetTempDir_abi_cxx11_((string *)&fs_dest,this_01);
          Json::Value::Value((Value *)&tdin,&this_01->Namespace);
          pVVar23 = Json::Value::operator[]((Value *)&tdif,"namespace");
          Json::Value::operator=(pVVar23,(Value *)&tdin);
          Json::Value::~Value((Value *)&tdin);
          Json::Value::Value((Value *)&tdin,&export_name);
          pVVar23 = Json::Value::operator[]((Value *)&tdif,"export-name");
          Json::Value::operator=(pVVar23,(Value *)&tdin);
          Json::Value::~Value((Value *)&tdin);
          Json::Value::Value((Value *)&tdin,&(this_01->super_cmInstallGenerator).Destination);
          pVVar23 = Json::Value::operator[]((Value *)&tdif,"destination");
          Json::Value::operator=(pVVar23,(Value *)&tdin);
          Json::Value::~Value((Value *)&tdin);
          Json::Value::Value((Value *)&tdin,(String *)&sf_map);
          pVVar23 = Json::Value::operator[]((Value *)&tdif,"cxx-module-info-dir");
          Json::Value::operator=(pVVar23,(Value *)&tdin);
          Json::Value::~Value((Value *)&tdin);
          Json::Value::Value((Value *)&tdin,(String *)&fs_dest);
          pVVar23 = Json::Value::operator[]((Value *)&tdif,"export-prefix");
          Json::Value::operator=(pVVar23,(Value *)&tdin);
          Json::Value::~Value((Value *)&tdin);
          Json::Value::Value((Value *)&tdin,true);
          pVVar23 = Json::Value::operator[]((Value *)&tdif,"install");
          Json::Value::operator=(pVVar23,(Value *)&tdin);
          Json::Value::~Value((Value *)&tdin);
          Json::Value::append(pVVar17,(Value *)&tdif);
          if (fs_dest.value_ != &fs_dest.comments_) {
            operator_delete(fs_dest.value_.string_,
                            (long)fs_dest.comments_.ptr_._M_t.
                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                  .
                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                  ._M_head_impl + 1);
          }
          if ((_Base_ptr *)sf_map._M_t._M_impl._0_8_ !=
              &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)sf_map._M_t._M_impl._0_8_,
                            (ulong)((long)&(sf_map._M_t._M_impl.super__Rb_tree_header._M_header.
                                           _M_parent)->_M_color + 1));
          }
          Json::Value::~Value((Value *)&tdif);
        }
      }
      p_Var28 = (_Base_ptr)std::_Rb_tree_increment(p_Var28);
    } while ((_Rb_tree_header *)p_Var28 != p_Var27);
  }
  pvVar29 = cmMakefile::GetExportBuildFileGenerators((this->super_cmCommonTargetGenerator).Makefile)
  ;
  puVar34 = (pvVar29->
            super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (pvVar29->
            super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar34 == puVar10) {
      GetTargetDependInfoPath(&tdin,this,local_328,config);
      cmGeneratedFileStream::cmGeneratedFileStream(&tdif,&tdin,false,None);
      Json::operator<<((OStream *)&tdif,&tdi);
      cmGeneratedFileStream::~cmGeneratedFileStream(&tdif);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tdin._M_dataplus._M_p != &tdin.field_2) {
        operator_delete(tdin._M_dataplus._M_p,tdin.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)export_name._M_dataplus._M_p != &export_name.field_2) {
        operator_delete(export_name._M_dataplus._M_p,export_name.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&all_file_sets);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&includes);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)mod_dir._M_dataplus._M_p != &mod_dir.field_2) {
        operator_delete(mod_dir._M_dataplus._M_p,
                        CONCAT71(mod_dir.field_2._M_allocated_capacity._1_7_,
                                 mod_dir.field_2._M_local_buf[0]) + 1);
      }
      Json::Value::~Value(&tdi);
      return;
    }
    objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmExportBuildFileGenerator::GetTargets
              ((puVar34->_M_t).
               super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
               .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&objectSources);
    psVar18 = cmGeneratorTarget::GetName_abi_cxx11_
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    ppcVar38 = objectSources.
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    ppcVar35 = objectSources.
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_348 = local_338;
    pcVar4 = (psVar18->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,pcVar4,pcVar4 + psVar18->_M_string_length);
    fs_type._M_dataplus._M_p = (pointer)&fs_type.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fs_type,local_348,local_340 + (long)local_348);
    fs_dest.value_ = (ValueHolder)&fs_dest.comments_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fs_dest,fs_type._M_dataplus._M_p,
               fs_type._M_dataplus._M_p + fs_type._M_string_length);
    puVar2 = &tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    sf_map._M_t._M_impl._0_8_ = &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sf_map,fs_dest.value_.int_,fs_dest.value_.string_ + fs_dest._8_8_);
    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)puVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&tdif,sf_map._M_t._M_impl._0_8_,
               CONCAT44(sf_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                        sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color) +
               sf_map._M_t._M_impl._0_8_);
    tdin._M_dataplus._M_p = (pointer)&tdin.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&tdin,
               tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
               _vptr_basic_ostream,
               tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ +
               (long)tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                     _vptr_basic_ostream);
    if (tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
        != (_func_int **)puVar2) {
      operator_delete(tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                      + 1);
    }
    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)puVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&tdif,tdin._M_dataplus._M_p,
               tdin._M_dataplus._M_p +
               CONCAT44(tdin._M_string_length._4_4_,(undefined4)tdin._M_string_length));
    uVar25 = tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_;
    __s2 = tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
           _vptr_basic_ostream;
    lVar37 = (long)ppcVar38 - (long)ppcVar35 >> 7;
    ppcVar33 = ppcVar35;
    if (0 < lVar37) {
      ppcVar33 = (pointer)(((long)ppcVar38 - (long)ppcVar35 & 0xffffffffffffff80U) + (long)ppcVar35)
      ;
      lVar37 = lVar37 + 1;
      ppcVar39 = ppcVar35 + 8;
      do {
        pcVar6 = ppcVar39[-7];
        if (pcVar6 == (cmSourceFile *)uVar25) {
          if (pcVar6 == (cmSourceFile *)0x0) {
            ppcVar40 = ppcVar39 + -8;
            goto LAB_0028969e;
          }
          iVar15 = bcmp(ppcVar39[-8],__s2,(size_t)pcVar6);
          ppcVar40 = ppcVar35;
          if (iVar15 == 0) goto LAB_0028969e;
        }
        pcVar6 = ppcVar39[-3];
        if (pcVar6 == (cmSourceFile *)uVar25) {
          if (pcVar6 == (cmSourceFile *)0x0) {
            ppcVar40 = ppcVar35 + 4;
            goto LAB_0028969e;
          }
          iVar15 = bcmp(ppcVar39[-4],__s2,(size_t)pcVar6);
          if (iVar15 == 0) {
            ppcVar40 = ppcVar39 + -4;
            goto LAB_0028969e;
          }
        }
        pcVar6 = ppcVar39[1];
        if (pcVar6 == (cmSourceFile *)uVar25) {
          ppcVar40 = ppcVar39;
          if (pcVar6 == (cmSourceFile *)0x0) goto LAB_0028969e;
          iVar15 = bcmp(*ppcVar39,__s2,(size_t)pcVar6);
          if (iVar15 == 0) {
            ppcVar40 = ppcVar35 + 8;
            goto LAB_0028969e;
          }
        }
        pcVar6 = ppcVar39[5];
        if (pcVar6 == (cmSourceFile *)uVar25) {
          if (pcVar6 == (cmSourceFile *)0x0) {
            ppcVar40 = ppcVar35 + 0xc;
            goto LAB_0028969e;
          }
          iVar15 = bcmp(ppcVar39[4],__s2,(size_t)pcVar6);
          if (iVar15 == 0) {
            ppcVar40 = ppcVar39 + 4;
            goto LAB_0028969e;
          }
        }
        ppcVar35 = ppcVar35 + 0x10;
        lVar37 = lVar37 + -1;
        ppcVar39 = ppcVar39 + 0x10;
      } while (1 < lVar37);
    }
    lVar37 = (long)ppcVar38 - (long)ppcVar33 >> 5;
    if (lVar37 == 1) {
LAB_00289636:
      pcVar6 = ppcVar33[1];
      ppcVar40 = ppcVar38;
      if (((pcVar6 == (cmSourceFile *)
                      tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_)
          && (ppcVar40 = ppcVar33, pcVar6 != (cmSourceFile *)0x0)) &&
         (iVar15 = bcmp(*ppcVar33,
                        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,(size_t)pcVar6), iVar15 != 0)) {
        ppcVar40 = ppcVar38;
      }
    }
    else if (lVar37 == 2) {
LAB_0028960a:
      pcVar6 = ppcVar33[1];
      if ((pcVar6 != (cmSourceFile *)
                     tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_)
         || ((ppcVar40 = ppcVar33, pcVar6 != (cmSourceFile *)0x0 &&
             (iVar15 = bcmp(*ppcVar33,
                            tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream,(size_t)pcVar6), iVar15 != 0)))) {
        ppcVar33 = ppcVar33 + 4;
        goto LAB_00289636;
      }
    }
    else {
      ppcVar40 = ppcVar38;
      if ((lVar37 == 3) &&
         ((pcVar6 = ppcVar33[1],
          pcVar6 != (cmSourceFile *)
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ ||
          ((ppcVar40 = ppcVar33, pcVar6 != (cmSourceFile *)0x0 &&
           (iVar15 = bcmp(*ppcVar33,
                          tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,(size_t)pcVar6), iVar15 != 0)))))) {
        ppcVar33 = ppcVar33 + 4;
        goto LAB_0028960a;
      }
    }
LAB_0028969e:
    if (tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
        != (_func_int **)
           &tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tdin._M_dataplus._M_p != &tdin.field_2) {
      operator_delete(tdin._M_dataplus._M_p,tdin.field_2._M_allocated_capacity + 1);
    }
    if ((_Base_ptr *)sf_map._M_t._M_impl._0_8_ !=
        &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)sf_map._M_t._M_impl._0_8_,
                      (ulong)((long)&(sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                     ->_M_color + 1));
    }
    if (fs_dest.value_ != &fs_dest.comments_) {
      operator_delete(fs_dest.value_.string_,
                      (long)fs_dest.comments_.ptr_._M_t.
                            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            .
                            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                            ._M_head_impl + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fs_type._M_dataplus._M_p != &fs_type.field_2) {
      operator_delete(fs_type._M_dataplus._M_p,fs_type.field_2._M_allocated_capacity + 1);
    }
    if (local_348 != local_338) {
      operator_delete(local_348,local_338[0] + 1);
    }
    if (ppcVar40 != ppcVar38) {
      Json::Value::Value((Value *)&tdif,objectValue);
      pcVar11 = (puVar34->_M_t).
                super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl;
      sf_map._M_t._M_impl._0_8_ = &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      _Var36._M_p = (pcVar11->super_cmExportFileGenerator).Namespace._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&sf_map,_Var36._M_p,
                 _Var36._M_p + (pcVar11->super_cmExportFileGenerator).Namespace._M_string_length);
      psVar18 = cmExportFileGenerator::GetMainExportFileName_abi_cxx11_
                          (&((puVar34->_M_t).
                             super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                             .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>.
                            _M_head_impl)->super_cmExportFileGenerator);
      pcVar11 = (puVar34->_M_t).
                super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl;
      cmsys::SystemTools::GetParentDirectory((string *)&fs_dest,psVar18);
      psVar18 = cmExportFileGenerator::GetMainExportFileName_abi_cxx11_
                          (&((puVar34->_M_t).
                             super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                             .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>.
                            _M_head_impl)->super_cmExportFileGenerator);
      cmsys::SystemTools::GetFilenamePath(&fs_type,psVar18);
      Json::Value::Value((Value *)&tdin,(String *)&sf_map);
      pVVar23 = Json::Value::operator[]((Value *)&tdif,"namespace");
      Json::Value::operator=(pVVar23,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      Json::Value::Value((Value *)&tdin,&export_name);
      pVVar23 = Json::Value::operator[]((Value *)&tdif,"export-name");
      Json::Value::operator=(pVVar23,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      Json::Value::Value((Value *)&tdin,(String *)&fs_dest);
      pVVar23 = Json::Value::operator[]((Value *)&tdif,"destination");
      Json::Value::operator=(pVVar23,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      Json::Value::Value((Value *)&tdin,&pcVar11->CxxModulesDirectory);
      pVVar23 = Json::Value::operator[]((Value *)&tdif,"cxx-module-info-dir");
      Json::Value::operator=(pVVar23,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      Json::Value::Value((Value *)&tdin,&fs_type);
      pVVar23 = Json::Value::operator[]((Value *)&tdif,"export-prefix");
      Json::Value::operator=(pVVar23,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      Json::Value::Value((Value *)&tdin,false);
      pVVar23 = Json::Value::operator[]((Value *)&tdif,"install");
      Json::Value::operator=(pVVar23,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      Json::Value::append(pVVar17,(Value *)&tdif);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fs_type._M_dataplus._M_p != &fs_type.field_2) {
        operator_delete(fs_type._M_dataplus._M_p,fs_type.field_2._M_allocated_capacity + 1);
      }
      if (fs_dest.value_ != &fs_dest.comments_) {
        operator_delete(fs_dest.value_.string_,
                        (long)fs_dest.comments_.ptr_._M_t.
                              super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                              .
                              super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                              ._M_head_impl + 1);
      }
      if ((_Base_ptr *)sf_map._M_t._M_impl._0_8_ !=
          &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)sf_map._M_t._M_impl._0_8_,
                        (ulong)((long)&(sf_map._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      Json::Value::~Value((Value *)&tdif);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&objectSources);
    puVar34 = puVar34 + 1;
  } while( true );
}

Assistant:

void cmNinjaTargetGenerator::WriteTargetDependInfo(std::string const& lang,
                                                   const std::string& config)
{
  Json::Value tdi(Json::objectValue);
  tdi["language"] = lang;
  tdi["compiler-id"] = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILER_ID"));

  std::string mod_dir;
  if (lang == "Fortran") {
    mod_dir = this->GeneratorTarget->GetFortranModuleDirectory(
      this->Makefile->GetHomeOutputDirectory());
  } else if (lang == "CXX") {
    mod_dir = this->GetGlobalGenerator()->ExpandCFGIntDir(
      cmSystemTools::CollapseFullPath(this->GeneratorTarget->ObjectDirectory),
      config);
  }
  if (mod_dir.empty()) {
    mod_dir = this->Makefile->GetCurrentBinaryDirectory();
  }
  tdi["module-dir"] = mod_dir;

  if (lang == "Fortran") {
    tdi["submodule-sep"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
    tdi["submodule-ext"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
  } else if (lang == "CXX") {
    // No extra information necessary.
  }

  tdi["dir-cur-bld"] = this->Makefile->GetCurrentBinaryDirectory();
  tdi["dir-cur-src"] = this->Makefile->GetCurrentSourceDirectory();
  tdi["dir-top-bld"] = this->Makefile->GetHomeOutputDirectory();
  tdi["dir-top-src"] = this->Makefile->GetHomeDirectory();

  Json::Value& tdi_include_dirs = tdi["include-dirs"] = Json::arrayValue;
  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, config);
  for (std::string const& i : includes) {
    // Convert the include directories the same way we do for -I flags.
    // See upstream ninja issue 1251.
    tdi_include_dirs.append(this->ConvertToNinjaPath(i));
  }

  Json::Value& tdi_linked_target_dirs = tdi["linked-target-dirs"] =
    Json::arrayValue;
  for (std::string const& l : this->GetLinkedTargetDirectories(config)) {
    tdi_linked_target_dirs.append(l);
  }

  cmTarget* tgt = this->GeneratorTarget->Target;
  auto all_file_sets = tgt->GetAllFileSetNames();
  Json::Value& tdi_cxx_module_info = tdi["cxx-modules"] = Json::objectValue;
  for (auto const& file_set_name : all_file_sets) {
    auto* file_set = tgt->GetFileSet(file_set_name);
    if (!file_set) {
      this->GetMakefile()->IssueMessage(
        MessageType::INTERNAL_ERROR,
        cmStrCat("Target \"", tgt->GetName(),
                 "\" is tracked to have file set \"", file_set_name,
                 "\", but it was not found."));
      continue;
    }
    auto fs_type = file_set->GetType();
    // We only care about C++ module sources here.
    if (fs_type != "CXX_MODULES"_s) {
      continue;
    }

    auto fileEntries = file_set->CompileFileEntries();
    auto directoryEntries = file_set->CompileDirectoryEntries();

    auto directories = file_set->EvaluateDirectoryEntries(
      directoryEntries, this->GeneratorTarget->LocalGenerator, config,
      this->GeneratorTarget);
    std::map<std::string, std::vector<std::string>> files_per_dirs;
    for (auto const& entry : fileEntries) {
      file_set->EvaluateFileEntry(directories, files_per_dirs, entry,
                                  this->GeneratorTarget->LocalGenerator,
                                  config, this->GeneratorTarget);
    }

    std::map<std::string, cmSourceFile const*> sf_map;
    {
      std::vector<cmSourceFile const*> objectSources;
      this->GeneratorTarget->GetObjectSources(objectSources, config);
      for (auto const* sf : objectSources) {
        auto full_path = sf->GetFullPath();
        if (full_path.empty()) {
          this->GetMakefile()->IssueMessage(
            MessageType::INTERNAL_ERROR,
            cmStrCat("Target \"", tgt->GetName(),
                     "\" has a full path-less source file."));
          continue;
        }
        sf_map[full_path] = sf;
      }
    }

    Json::Value fs_dest = Json::nullValue;
    for (auto const& ig : this->GetMakefile()->GetInstallGenerators()) {
      if (auto const* fsg =
            dynamic_cast<cmInstallFileSetGenerator const*>(ig.get())) {
        if (fsg->GetTarget() == this->GeneratorTarget &&
            fsg->GetFileSet() == file_set) {
          fs_dest = fsg->GetDestination(config);
          continue;
        }
      }
    }

    for (auto const& files_per_dir : files_per_dirs) {
      for (auto const& file : files_per_dir.second) {
        auto lookup = sf_map.find(file);
        if (lookup == sf_map.end()) {
          this->GetMakefile()->IssueMessage(
            MessageType::INTERNAL_ERROR,
            cmStrCat("Target \"", tgt->GetName(), "\" has source file \"",
                     file,
                     R"(" which is not in any of its "FILE_SET BASE_DIRS".)"));
          continue;
        }

        auto const* sf = lookup->second;

        if (!sf) {
          this->GetMakefile()->IssueMessage(
            MessageType::INTERNAL_ERROR,
            cmStrCat("Target \"", tgt->GetName(), "\" has source file \"",
                     file, "\" which has not been tracked properly."));
          continue;
        }

        auto obj_path = this->GetObjectFilePath(sf, config);
        Json::Value& tdi_module_info = tdi_cxx_module_info[obj_path] =
          Json::objectValue;

        tdi_module_info["source"] = file;
        tdi_module_info["relative-directory"] = files_per_dir.first;
        tdi_module_info["name"] = file_set->GetName();
        tdi_module_info["type"] = file_set->GetType();
        tdi_module_info["visibility"] =
          std::string(cmFileSetVisibilityToName(file_set->GetVisibility()));
        tdi_module_info["destination"] = fs_dest;
      }
    }
  }

  tdi["config"] = config;

  // Add information about the export sets that this target is a member of.
  Json::Value& tdi_exports = tdi["exports"] = Json::arrayValue;
  std::string export_name = this->GeneratorTarget->GetExportName();

  cmInstallCxxModuleBmiGenerator const* bmi_gen = nullptr;
  for (auto const& ig : this->GetMakefile()->GetInstallGenerators()) {
    if (auto const* bmig =
          dynamic_cast<cmInstallCxxModuleBmiGenerator const*>(ig.get())) {
      if (bmig->GetTarget() == this->GeneratorTarget) {
        bmi_gen = bmig;
        continue;
      }
    }
  }
  if (bmi_gen) {
    Json::Value tdi_bmi_info = Json::objectValue;

    tdi_bmi_info["permissions"] = bmi_gen->GetFilePermissions();
    tdi_bmi_info["destination"] = bmi_gen->GetDestination(config);
    const char* msg_level = "";
    switch (bmi_gen->GetMessageLevel()) {
      case cmInstallGenerator::MessageDefault:
        break;
      case cmInstallGenerator::MessageAlways:
        msg_level = "MESSAGE_ALWAYS";
        break;
      case cmInstallGenerator::MessageLazy:
        msg_level = "MESSAGE_LAZY";
        break;
      case cmInstallGenerator::MessageNever:
        msg_level = "MESSAGE_NEVER";
        break;
    }
    tdi_bmi_info["message-level"] = msg_level;
    tdi_bmi_info["script-location"] = bmi_gen->GetScriptLocation(config);

    tdi["bmi-installation"] = tdi_bmi_info;
  } else {
    tdi["bmi-installation"] = Json::nullValue;
  }

  auto const& all_install_exports =
    this->GetGlobalGenerator()->GetExportSets();
  for (auto const& exp : all_install_exports) {
    // Ignore exports sets which are not for this target.
    auto const& targets = exp.second.GetTargetExports();
    auto tgt_export =
      std::find_if(targets.begin(), targets.end(),
                   [this](std::unique_ptr<cmTargetExport> const& te) {
                     return te->Target == this->GeneratorTarget;
                   });
    if (tgt_export == targets.end()) {
      continue;
    }

    auto const* installs = exp.second.GetInstallations();
    for (auto const* install : *installs) {
      Json::Value tdi_export_info = Json::objectValue;

      auto const& ns = install->GetNamespace();
      auto const& dest = install->GetDestination();
      auto const& cxxm_dir = install->GetCxxModuleDirectory();
      auto const& export_prefix = install->GetTempDir();

      tdi_export_info["namespace"] = ns;
      tdi_export_info["export-name"] = export_name;
      tdi_export_info["destination"] = dest;
      tdi_export_info["cxx-module-info-dir"] = cxxm_dir;
      tdi_export_info["export-prefix"] = export_prefix;
      tdi_export_info["install"] = true;

      tdi_exports.append(tdi_export_info);
    }
  }

  auto const& all_build_exports =
    this->GetMakefile()->GetExportBuildFileGenerators();
  for (auto const& exp : all_build_exports) {
    std::vector<std::string> targets;
    exp->GetTargets(targets);

    // Ignore exports sets which are not for this target.
    auto const& name = this->GeneratorTarget->GetName();
    bool has_current_target =
      std::any_of(targets.begin(), targets.end(),
                  [name](std::string const& tname) { return tname == name; });
    if (!has_current_target) {
      continue;
    }

    Json::Value tdi_export_info = Json::objectValue;

    auto const& ns = exp->GetNamespace();
    auto const& main_fn = exp->GetMainExportFileName();
    auto const& cxxm_dir = exp->GetCxxModuleDirectory();
    auto dest = cmsys::SystemTools::GetParentDirectory(main_fn);
    auto const& export_prefix =
      cmSystemTools::GetFilenamePath(exp->GetMainExportFileName());

    tdi_export_info["namespace"] = ns;
    tdi_export_info["export-name"] = export_name;
    tdi_export_info["destination"] = dest;
    tdi_export_info["cxx-module-info-dir"] = cxxm_dir;
    tdi_export_info["export-prefix"] = export_prefix;
    tdi_export_info["install"] = false;

    tdi_exports.append(tdi_export_info);
  }

  std::string const tdin = this->GetTargetDependInfoPath(lang, config);
  cmGeneratedFileStream tdif(tdin);
  tdif << tdi;
}